

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O1

unique_ptr<spvtools::opt::analysis::ArrayConstant,_std::default_delete<spvtools::opt::analysis::ArrayConstant>_>
 __thiscall spvtools::opt::analysis::ArrayConstant::CopyArrayConstant(ArrayConstant *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  long in_RSI;
  
  p_Var1 = (_func_int *)(**(code **)(**(long **)(in_RSI + 8) + 0xc0))();
  pp_Var2 = (_func_int **)operator_new(0x28);
  pp_Var2[1] = p_Var1;
  *pp_Var2 = (_func_int *)&PTR__CompositeConstant_00b1cc78;
  std::
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            *)(pp_Var2 + 2),
           (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            *)(in_RSI + 0x10));
  *pp_Var2 = (_func_int *)&PTR__CompositeConstant_00b1cf30;
  (this->super_CompositeConstant).super_Constant._vptr_Constant = pp_Var2;
  return (__uniq_ptr_data<spvtools::opt::analysis::ArrayConstant,_std::default_delete<spvtools::opt::analysis::ArrayConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::ArrayConstant,_std::default_delete<spvtools::opt::analysis::ArrayConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ArrayConstant> CopyArrayConstant() const {
    return MakeUnique<ArrayConstant>(type_->AsArray(), components_);
  }